

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHsh.h
# Opt level: O0

Hsh_VecMan_t * Hsh_VecManStart(int nEntries)

{
  int nSize;
  Hsh_VecMan_t *pHVar1;
  Vec_Int_t *pVVar2;
  Hsh_VecMan_t *p;
  int nEntries_local;
  
  pHVar1 = (Hsh_VecMan_t *)calloc(1,0x48);
  nSize = Abc_PrimeCudd(nEntries);
  pVVar2 = Vec_IntStartFull(nSize);
  pHVar1->vTable = pVVar2;
  pVVar2 = Vec_IntAlloc(nEntries << 2);
  pHVar1->vData = pVVar2;
  pVVar2 = Vec_IntAlloc(nEntries);
  pHVar1->vMap = pVVar2;
  return pHVar1;
}

Assistant:

static inline Hsh_VecMan_t * Hsh_VecManStart( int nEntries )
{
    Hsh_VecMan_t * p;
    p = ABC_CALLOC( Hsh_VecMan_t, 1 );
    p->vTable = Vec_IntStartFull( Abc_PrimeCudd(nEntries) );
    p->vData  = Vec_IntAlloc( nEntries * 4 );
    p->vMap   = Vec_IntAlloc( nEntries );
    return p;
}